

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_counter_test.cc
# Opt level: O1

void anon_unknown.dwarf_1a7362::CounterOnATemplate<int>(void)

{
  int iVar1;
  string_view name;
  
  if (::(anonymous_namespace)::CounterOnATemplate<int>()::counter == '\0') {
    iVar1 = __cxa_guard_acquire(&::(anonymous_namespace)::CounterOnATemplate<int>()::counter);
    if (iVar1 != 0) {
      CounterOnATemplate<int>::counter.counter_.super___atomic_base<unsigned_long>._M_i =
           (atomic<unsigned_long>)(__atomic_base<unsigned_long>)0x0;
      name._M_str = "Foo.Bar";
      name._M_len = 7;
      google::protobuf::internal::RealDebugCounter::Register(&CounterOnATemplate<int>::counter,name)
      ;
      __cxa_guard_release(&::(anonymous_namespace)::CounterOnATemplate<int>()::counter);
    }
  }
  CounterOnATemplate<int>::counter.counter_.super___atomic_base<unsigned_long>._M_i =
       (atomic<unsigned_long>)
       ((long)CounterOnATemplate<int>::counter.counter_.super___atomic_base<unsigned_long>._M_i + 1)
  ;
  return;
}

Assistant:

void CounterOnATemplate() {
  static google::protobuf::internal::RealDebugCounter counter("Foo.Bar");
  counter.Inc();
}